

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatSoldier.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::Encode
          (GED_BasicGroundCombatSoldier *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GED_BasicGroundCombatSoldier *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui16EntityID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i16Offsets[0]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i16Offsets[1]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i16Offsets[2]);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_EA).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Ori[0]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Ori[1]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Ori[2]);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8Spd);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8HdAz);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8HdElv);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_i8HdScanRt);
  KDataStream::operator<<(pKVar1,this->m_i8HdElvRt);
  return;
}

Assistant:

void GED_BasicGroundCombatSoldier::Encode( KDataStream & stream ) const
{
    stream << m_ui16EntityID
           << m_i16Offsets[0]
           << m_i16Offsets[1]
           << m_i16Offsets[2]
           << KDIS_STREAM m_EA
           << m_i8Ori[0]
           << m_i8Ori[1]
           << m_i8Ori[2]
           << m_i8Spd
           << m_i8HdAz
           << m_i8HdElv
           << m_i8HdScanRt
           << m_i8HdElvRt;
}